

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void client_set_focused(natwm_state *state,client *client)

{
  theme *ptVar1;
  workspace *workspace_00;
  uint16_t local_2a;
  uint16_t previous_border_width;
  theme *theme;
  workspace *workspace;
  client *client_local;
  natwm_state *state_local;
  
  if (((client != (client *)0x0) && ((client->state & CLIENT_HIDDEN) == 0)) &&
     (workspace_00 = workspace_list_find_client_workspace(state->workspace_list,client),
     workspace_00 != (workspace *)0x0)) {
    ptVar1 = state->workspace_list->theme;
    client->is_focused = true;
    client_set_window_input_focus(state,client->window);
    if ((workspace_00->is_focused & 1U) == 0) {
      workspace_set_focused(state,workspace_00);
    }
    button_binding_ungrab(state,client->window,&client_focus_event);
    local_2a = ptVar1->border_width->unfocused;
    if ((client->state & CLIENT_UNTHEMED) != 0) {
      local_2a = 0;
    }
    update_theme(state,client,local_2a);
  }
  return;
}

Assistant:

void client_set_focused(struct natwm_state *state, struct client *client)
{
        if (client == NULL || client->state & CLIENT_HIDDEN) {
                return;
        }

        struct workspace *workspace
                = workspace_list_find_client_workspace(state->workspace_list, client);

        if (workspace == NULL) {
                return;
        }

        struct theme *theme = state->workspace_list->theme;

        client->is_focused = true;

        client_set_window_input_focus(state, client->window);

        if (!workspace->is_focused) {
                workspace_set_focused(state, workspace);
        }

        // Now that we have focused the client, there is no need for "click to
        // focus" so we can remove the button grab
        button_binding_ungrab(state, client->window, &client_focus_event);

        uint16_t previous_border_width = theme->border_width->unfocused;

        // If we have not added a border to this client before than the window
        // rect has not accounted for it
        if (client->state & CLIENT_UNTHEMED) {
                previous_border_width = 0;
        }

        update_theme(state, client, previous_border_width);
}